

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall ON_Extrusion::GetProfilePlane(ON_Extrusion *this,double s,ON_Plane *plane)

{
  ON_3dVector *a;
  double dVar1;
  bool bVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  byte bVar6;
  ON_Plane p;
  ON_Xform xform;
  
  bVar6 = 0;
  ON_Plane::ON_Plane(&p);
  p.origin.z = ON_3dPoint::Origin.z;
  p.origin.x = ON_3dPoint::Origin.x;
  p.origin.y = ON_3dPoint::Origin.y;
  PathTangent((ON_3dVector *)&xform,this);
  p.zaxis.z = xform.m_xform[0][2];
  p.zaxis.x = xform.m_xform[0][0];
  p.zaxis.y = xform.m_xform[0][1];
  a = &p.yaxis;
  p.yaxis.x = (this->m_up).x;
  p.yaxis.y = (this->m_up).y;
  p.yaxis.z = (this->m_up).z;
  ON_CrossProduct((ON_3dVector *)&xform,a,&p.zaxis);
  p.xaxis.z = xform.m_xform[0][2];
  p.xaxis.x = xform.m_xform[0][0];
  p.xaxis.y = xform.m_xform[0][1];
  bVar2 = ON_3dVector::Unitize(&p.xaxis);
  if (bVar2) {
    bVar2 = ON_3dVector::Unitize(a);
    if (bVar2) {
      ON_Plane::UpdateEquation(&p);
      bVar2 = ON_Plane::IsValid(&p);
      if (!bVar2) {
        ON_CrossProduct((ON_3dVector *)&xform,&p.zaxis,&p.xaxis);
        p.yaxis.z = xform.m_xform[0][2];
        p.yaxis.x = xform.m_xform[0][0];
        p.yaxis.y = xform.m_xform[0][1];
        ON_3dVector::Unitize(a);
        bVar2 = ON_Plane::IsValid(&p);
        if (!bVar2) goto LAB_003ef2d2;
      }
      if (((this->m_bHaveN[0] != true) ||
          ((((dVar1 = this->m_N[0].x, dVar1 == 0.0 && (!NAN(dVar1))) &&
            (dVar1 = this->m_N[0].y, dVar1 == 0.0)) && (!NAN(dVar1))))) &&
         ((this->m_bHaveN[1] != true ||
          (((dVar1 = this->m_N[1].x, dVar1 == 0.0 && (!NAN(dVar1))) &&
           ((dVar1 = this->m_N[1].y, dVar1 == 0.0 && (!NAN(dVar1))))))))) {
        dVar1 = ON_Interval::ParameterAt(&this->m_t,s);
        ON_Line::PointAt((ON_3dPoint *)&xform,&this->m_path,dVar1);
        p.origin.z = xform.m_xform[0][2];
        p.origin.x = xform.m_xform[0][0];
        p.origin.y = xform.m_xform[0][1];
        ON_Plane::UpdateEquation(&p);
LAB_003ef27b:
        pOVar4 = &p;
        pOVar5 = plane;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pOVar5->origin).x = (pOVar4->origin).x;
          pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
          pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
        }
        bVar2 = ON_Plane::IsValid(plane);
        goto LAB_003ef2d4;
      }
      ON_Xform::ON_Xform(&xform);
      bVar2 = GetProfileTransformation(this,s,&xform);
      if (bVar2) {
        bVar2 = ON_Plane::Transform(&p,&xform);
        if (bVar2) goto LAB_003ef27b;
      }
    }
  }
LAB_003ef2d2:
  bVar2 = false;
LAB_003ef2d4:
  ON_Plane::~ON_Plane(&p);
  return bVar2;
}

Assistant:

bool ON_Extrusion::GetProfilePlane( double s, ON_Plane& plane ) const
{
  ON_Plane p;
  p.origin = ON_3dPoint::Origin;
  p.zaxis = PathTangent();
  p.yaxis = m_up;
  p.xaxis = ON_CrossProduct(p.yaxis,p.zaxis);
  if ( !p.xaxis.Unitize() )
    return false;
  if ( !p.yaxis.Unitize() )
    return false;
  p.UpdateEquation();
  if ( !p.IsValid() )
  {
    p.yaxis = ON_CrossProduct(p.zaxis,p.xaxis);
    p.yaxis.Unitize();
    if ( !p.IsValid() )
      return false;
  }
  if (    (!m_bHaveN[0] || (0.0 == m_N[0].x && 0.0 == m_N[0].y)) 
       && (!m_bHaveN[1] || (0.0 == m_N[1].x && 0.0 == m_N[1].y)) 
     )
  {
    p.origin = m_path.PointAt(m_t.ParameterAt(s));
    p.UpdateEquation();
    plane = p;
  }
  else
  {
    ON_Xform xform;
    if ( !GetProfileTransformation(s,xform) )
      return false;
    if (!p.Transform(xform))
      return false;
    plane = p;
  }
  return plane.IsValid();
}